

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenkoFPM.cpp
# Opt level: O2

void __thiscall
chrono::fea::BeamTaperedTimoshenkoFPM::Evaluate
          (BeamTaperedTimoshenkoFPM *this,ChMatrixNM<double,_12,_12> *result,double x)

{
  int iVar1;
  ostream *poVar2;
  shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM> tapered_section_fpm;
  ChMatrixNM<double,_6,_6> Mlaw_point;
  ChMatrixNM<double,_6,_6> Rlaw_point;
  ChMatrixNM<double,_6,_6> Klaw_point;
  ChMatrixNM<double,_6,_12> Bx;
  ChMatrixNM<double,_6,_12> Nx;
  ShapeFunctionGroupFPM NxBx;
  __shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
  local_e10;
  ChMatrixNM<double,_6,_6> local_e00;
  Matrix<double,_6,_6,_1,_6,_6> local_ce0;
  Matrix<double,_6,_6,_1,_6,_6> local_bc0;
  Matrix<double,_6,_6,_1,_6,_6> local_aa0;
  Matrix<double,_6,_12,_1,_6,_12> local_980;
  Matrix<double,_6,_12,_1,_6,_12> local_740;
  ShapeFunctionGroupFPM local_500;
  
  ChElementBeamTaperedTimoshenkoFPM::ShapeFunctionsTimoshenkoFPM(this->m_element,&local_500,x);
  memcpy(&local_740,
         &local_500.
          super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>_>
          .super__Head_base<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_false>,0x240);
  memcpy(&local_980,&local_500,0x240);
  std::
  __shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_e10,
                 &(this->m_element->tapered_section_fpm).
                  super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
                );
  iVar1 = this->m_choice_KiRiMi;
  if (iVar1 == 0) {
    ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM::GetKlawAtPoint(&local_e00,local_e10._M_ptr,x);
    memcpy(&local_aa0,&local_e00,0x120);
    local_e00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0]
         = (double)&local_980;
    local_e00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[1]
         = (double)&local_aa0;
    local_e00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[2]
         = (double)&local_980;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,12,12,1,12,12>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,12,1,6,12>>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,12,1,6,12>,0>>
              (result,(Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_0>
                       *)&local_e00);
  }
  else if (iVar1 == 1) {
    ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM::GetRlawAtPoint(&local_e00,local_e10._M_ptr,x);
    memcpy(&local_bc0,&local_e00,0x120);
    local_e00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0]
         = (double)&local_980;
    local_e00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[1]
         = (double)&local_bc0;
    local_e00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[2]
         = (double)&local_980;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,12,12,1,12,12>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,12,1,6,12>>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,12,1,6,12>,0>>
              (result,(Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_0>
                       *)&local_e00);
  }
  else if (iVar1 == 2) {
    ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM::GetMlawAtPoint(&local_e00,local_e10._M_ptr,x);
    memcpy(&local_ce0,&local_e00,0x120);
    local_e00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0]
         = (double)&local_740;
    local_e00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[1]
         = (double)&local_ce0;
    local_e00.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[2]
         = (double)&local_740;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,12,12,1,12,12>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,12,1,6,12>>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,12,1,6,12>,0>>
              (result,(Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_0>
                       *)&local_e00);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Please input the correct option: 0,1,2");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e10._M_refcount);
  return;
}

Assistant:

void BeamTaperedTimoshenkoFPM::Evaluate(ChMatrixNM<double, 12, 12>& result, const double x) {
    double eta = x;

    ChElementBeamTaperedTimoshenkoFPM::ShapeFunctionGroupFPM NxBx;
    m_element->ShapeFunctionsTimoshenkoFPM(NxBx, eta);
    // shape function matrix
    ChMatrixNM<double, 6, 12> Nx = std::get<0>(NxBx);
    // strain-displacement relation matrix
    ChMatrixNM<double, 6, 12> Bx = std::get<1>(NxBx);

    auto tapered_section_fpm = m_element->GetTaperedSection();
    ChMatrixNM<double, 6, 6> Klaw_point;
    ChMatrixNM<double, 6, 6> Rlaw_point;
    ChMatrixNM<double, 6, 6> Mlaw_point;

    switch (m_choice_KiRiMi) {
        case 0:
            Klaw_point = tapered_section_fpm->GetKlawAtPoint(eta);
            result = Bx.transpose() * Klaw_point * Bx;
            break;
        case 1:
            Rlaw_point = tapered_section_fpm->GetRlawAtPoint(eta);
            result = Bx.transpose() * Rlaw_point * Bx;  // modified Rayleigh damping model
            break;
        case 2:
            Mlaw_point = tapered_section_fpm->GetMlawAtPoint(eta);
            result = Nx.transpose() * Mlaw_point * Nx;
            break;
        default:
            std::cout << "Please input the correct option: 0,1,2" << std::endl;
            return;
    }
}